

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

string * __thiscall
flatbuffers::EnumDef::AllFlags_abi_cxx11_(string *__return_storage_ptr__,EnumDef *this)

{
  bool bVar1;
  Value *pVVar2;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar3;
  reference ppEVar4;
  uint64_t uVar5;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_68;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_60;
  const_iterator it;
  uint64_t u64;
  allocator<char> local_39;
  string local_38;
  EnumDef *local_18;
  EnumDef *this_local;
  
  local_18 = this;
  this_local = (EnumDef *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"bit_flags",&local_39);
  pVVar2 = SymbolTable<flatbuffers::Value>::Lookup(&(this->super_Definition).attributes,&local_38);
  if (pVVar2 != (Value *)0x0) {
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    it._M_current = (EnumVal **)0x0;
    pvVar3 = Vals(this);
    local_60._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar3)
    ;
    while( true ) {
      pvVar3 = Vals(this);
      local_68._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar3)
      ;
      bVar1 = __gnu_cxx::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      ppEVar4 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_60);
      uVar5 = EnumVal::GetAsUInt64(*ppEVar4);
      it._M_current = uVar5 | it._M_current;
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_60);
    }
    bVar1 = IsUInt64(this);
    if (bVar1) {
      NumToString<unsigned_long>(__return_storage_ptr__,(unsigned_long)it._M_current);
    }
    else {
      NumToString<long>(__return_storage_ptr__,(long)it._M_current);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("attributes.Lookup(\"bit_flags\")",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                ,0x8fb,"std::string flatbuffers::EnumDef::AllFlags() const");
}

Assistant:

std::string EnumDef::AllFlags() const {
  FLATBUFFERS_ASSERT(attributes.Lookup("bit_flags"));
  uint64_t u64 = 0;
  for (auto it = Vals().begin(); it != Vals().end(); ++it) {
    u64 |= (*it)->GetAsUInt64();
  }
  return IsUInt64() ? NumToString(u64) : NumToString(static_cast<int64_t>(u64));
}